

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::doReplace
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  char16_t **ppcVar1;
  int32_t *piVar2;
  UnicodeString *pUVar3;
  UBool UVar4;
  uint uVar5;
  UnicodeString *pUVar6;
  int32_t iVar7;
  int iVar8;
  int growCapacity;
  int iVar9;
  int iVar10;
  UChar *s;
  ushort uVar11;
  int iVar12;
  bool bVar13;
  int32_t *bufferToDelete;
  UChar oldStackBuffer [27];
  UnicodeString *local_90;
  int32_t *local_80;
  UnicodeString local_78;
  
  uVar11 = (this->fUnion).fStackFields.fLengthAndFlags;
  uVar5 = (uint)uVar11;
  if ((uVar11 & 0x11) != 0) {
    return this;
  }
  iVar9 = (int)(short)uVar11 >> 5;
  iVar8 = (this->fUnion).fFields.fLength;
  iVar12 = iVar9;
  if ((short)uVar11 < 0) {
    iVar12 = iVar8;
  }
  if (srcLength == 0 && (uVar11 & 8) != 0) {
    if (start == 0) {
      iVar7 = length;
      if (iVar12 < length) {
        iVar7 = iVar12;
      }
      iVar8 = 0;
      if (-1 < length) {
        iVar8 = iVar7;
      }
      ppcVar1 = &(this->fUnion).fFields.fArray;
      *ppcVar1 = *ppcVar1 + iVar8;
      piVar2 = &(this->fUnion).fFields.fCapacity;
      *piVar2 = *piVar2 - iVar8;
      iVar12 = iVar12 - iVar8;
      if (iVar12 < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (short)iVar12 * 0x20 | uVar11 & 0xe;
        return this;
      }
      (this->fUnion).fStackFields.fLengthAndFlags = uVar11 | 0xffe0;
      (this->fUnion).fFields.fLength = iVar12;
      return this;
    }
    if (start < 0) {
      start = 0;
      if (length < iVar12) goto LAB_002e589b;
    }
    else {
      if (iVar12 < start) {
        start = iVar12;
      }
      if (length < iVar12 - start) goto LAB_002e589b;
      if (0x3ff < start) {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar11 | 0xffe0;
        (this->fUnion).fFields.fLength = start;
        goto LAB_002e599b;
      }
    }
    (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(start << 5) | uVar11 & 0xe;
LAB_002e599b:
    (this->fUnion).fFields.fCapacity = start;
    return this;
  }
LAB_002e589b:
  if (start == iVar12) {
    pUVar6 = doAppend(this,srcChars,srcStart,srcLength);
    return pUVar6;
  }
  if (srcChars == (UChar *)0x0) {
    srcLength = 0;
    s = (UChar *)0x0;
  }
  else {
    s = srcChars + srcStart;
    if (srcLength < 0) {
      srcLength = u_strlen_63(s);
      uVar5 = (uint)(this->fUnion).fStackFields.fLengthAndFlags;
      iVar8 = (this->fUnion).fFields.fLength;
      iVar9 = (int)uVar5 >> 5;
    }
  }
  if ((short)uVar5 < 0) {
    iVar9 = iVar8;
  }
  iVar8 = iVar9;
  if (start < iVar9) {
    iVar8 = start;
  }
  if (start < 0) {
    iVar8 = 0;
  }
  iVar10 = iVar9 - iVar8;
  if (length <= iVar9 - iVar8) {
    iVar10 = length;
  }
  if (length < 0) {
    iVar10 = 0;
  }
  if ((int)(iVar12 - iVar10 ^ 0x7fffffffU) < srcLength) {
    setToBogus(this);
    return this;
  }
  pUVar6 = (UnicodeString *)(this->fUnion).fStackFields.fBuffer;
  pUVar3 = (UnicodeString *)(this->fUnion).fFields.fArray;
  local_90 = pUVar6;
  if ((uVar5 & 2) == 0) {
    local_90 = pUVar3;
  }
  if ((uVar5 & 0x19) == 0) {
    bVar13 = true;
    if ((uVar5 & 4) != 0) {
      bVar13 = *(int *)((long)&pUVar3[-1].fUnion + 0x34) == 1;
    }
    if (((bVar13) && (local_90 < (UnicodeString *)(s + srcLength))) &&
       (s < (UChar *)((long)&(local_90->super_Replaceable).super_UObject._vptr_UObject +
                     (long)iVar12 * 2))) {
      UnicodeString(&local_78,s,srcLength);
      if ((local_78.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        if ((local_78.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_78.fUnion.fFields.fArray = local_78.fUnion.fStackFields.fBuffer;
        }
        this = doReplace(this,iVar8,iVar10,local_78.fUnion.fFields.fArray,0,srcLength);
      }
      else {
        setToBogus(this);
      }
      ~UnicodeString(&local_78);
      return this;
    }
  }
  iVar9 = (iVar12 - iVar10) + srcLength;
  if (((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) !=
       (undefined1  [56])0x0) && (0x1b < iVar9)) {
    u_memcpy_63((UChar *)&local_78,(UChar *)local_90,iVar12);
    local_90 = &local_78;
  }
  local_80 = (int32_t *)0x0;
  growCapacity = (iVar9 >> 2) + 0x80 + iVar9;
  if (0x7ffffff5 - iVar9 < (iVar9 >> 2) + 0x80) {
    growCapacity = 0x7ffffff5;
  }
  UVar4 = cloneArrayIfNeeded(this,iVar9,growCapacity,'\0',&local_80,'\0');
  if (UVar4 == '\0') {
    return this;
  }
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
      (undefined1  [56])0x0) {
    pUVar6 = (UnicodeString *)(this->fUnion).fFields.fArray;
  }
  if (pUVar6 == local_90) {
    if (iVar10 == srcLength) goto LAB_002e5adf;
  }
  else if (0 < iVar8) {
    memmove(pUVar6,local_90,(ulong)(uint)(iVar8 * 2));
  }
  iVar10 = iVar10 + iVar8;
  if (iVar12 - iVar10 != 0 && iVar10 <= iVar12) {
    memmove((void *)((long)&(pUVar6->super_Replaceable).super_UObject._vptr_UObject +
                    (long)(iVar8 + srcLength) * 2),
            (void *)((long)&(local_90->super_Replaceable).super_UObject._vptr_UObject +
                    (long)iVar10 * 2),(ulong)(uint)((iVar12 - iVar10) * 2));
  }
LAB_002e5adf:
  if (0 < srcLength) {
    memmove((void *)((long)&(pUVar6->super_Replaceable).super_UObject._vptr_UObject +
                    (long)iVar8 * 2),s,(ulong)(uint)(srcLength * 2));
  }
  uVar11 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (iVar9 < 0x400) {
    uVar11 = (short)iVar9 * 0x20 | uVar11 & 0x1f;
  }
  else {
    uVar11 = uVar11 | 0xffe0;
    (this->fUnion).fFields.fLength = iVar9;
  }
  (this->fUnion).fStackFields.fLengthAndFlags = uVar11;
  if (local_80 == (int32_t *)0x0) {
    return this;
  }
  uprv_free_63(local_80);
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doReplace(int32_t start,
             int32_t length,
             const UChar *srcChars,
             int32_t srcStart,
             int32_t srcLength)
{
  if(!isWritable()) {
    return *this;
  }

  int32_t oldLength = this->length();

  // optimize (read-only alias).remove(0, start) and .remove(start, end)
  if((fUnion.fFields.fLengthAndFlags&kBufferIsReadonly) && srcLength == 0) {
    if(start == 0) {
      // remove prefix by adjusting the array pointer
      pinIndex(length);
      fUnion.fFields.fArray += length;
      fUnion.fFields.fCapacity -= length;
      setLength(oldLength - length);
      return *this;
    } else {
      pinIndex(start);
      if(length >= (oldLength - start)) {
        // remove suffix by reducing the length (like truncate())
        setLength(start);
        fUnion.fFields.fCapacity = start;  // not NUL-terminated any more
        return *this;
      }
    }
  }

  if(start == oldLength) {
    return doAppend(srcChars, srcStart, srcLength);
  }

  if(srcChars == 0) {
    srcLength = 0;
  } else {
    // Perform all remaining operations relative to srcChars + srcStart.
    // From this point forward, do not use srcStart.
    srcChars += srcStart;
    if (srcLength < 0) {
      // get the srcLength if necessary
      srcLength = u_strlen(srcChars);
    }
  }

  // pin the indices to legal values
  pinIndices(start, length);

  // Calculate the size of the string after the replace.
  // Avoid int32_t overflow.
  int32_t newLength = oldLength - length;
  if(srcLength > (INT32_MAX - newLength)) {
    setToBogus();
    return *this;
  }
  newLength += srcLength;

  // Check for insertion into ourself
  const UChar *oldArray = getArrayStart();
  if (isBufferWritable() &&
      oldArray < srcChars + srcLength &&
      srcChars < oldArray + oldLength) {
    // Copy into a new UnicodeString and start over
    UnicodeString copy(srcChars, srcLength);
    if (copy.isBogus()) {
      setToBogus();
      return *this;
    }
    return doReplace(start, length, copy.getArrayStart(), 0, srcLength);
  }

  // cloneArrayIfNeeded(doCopyArray=FALSE) may change fArray but will not copy the current contents;
  // therefore we need to keep the current fArray
  UChar oldStackBuffer[US_STACKBUF_SIZE];
  if((fUnion.fFields.fLengthAndFlags&kUsingStackBuffer) && (newLength > US_STACKBUF_SIZE)) {
    // copy the stack buffer contents because it will be overwritten with
    // fUnion.fFields values
    u_memcpy(oldStackBuffer, oldArray, oldLength);
    oldArray = oldStackBuffer;
  }

  // clone our array and allocate a bigger array if needed
  int32_t *bufferToDelete = 0;
  if(!cloneArrayIfNeeded(newLength, getGrowCapacity(newLength),
                         FALSE, &bufferToDelete)
  ) {
    return *this;
  }

  // now do the replace

  UChar *newArray = getArrayStart();
  if(newArray != oldArray) {
    // if fArray changed, then we need to copy everything except what will change
    us_arrayCopy(oldArray, 0, newArray, 0, start);
    us_arrayCopy(oldArray, start + length,
                 newArray, start + srcLength,
                 oldLength - (start + length));
  } else if(length != srcLength) {
    // fArray did not change; copy only the portion that isn't changing, leaving a hole
    us_arrayCopy(oldArray, start + length,
                 newArray, start + srcLength,
                 oldLength - (start + length));
  }

  // now fill in the hole with the new string
  us_arrayCopy(srcChars, 0, newArray, start, srcLength);

  setLength(newLength);

  // delayed delete in case srcChars == fArray when we started, and
  // to keep oldArray alive for the above operations
  if (bufferToDelete) {
    uprv_free(bufferToDelete);
  }

  return *this;
}